

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regression_suite.cpp
# Opt level: O0

void cumulative_double::run(void)

{
  test_ctor();
  test_same();
  test_linear_increase();
  test_linear_increase__offset();
  test_linear_decrease();
  test_scatter();
  return;
}

Assistant:

void run()
{
    test_ctor();
    test_same();
    test_linear_increase();
    test_linear_increase__offset();
    test_linear_decrease();
    test_scatter();
}